

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O2

void amrex::EB_set_covered_faces(Array<MultiFab_*,_3> *umac,Real val)

{
  uint uVar1;
  int iVar2;
  Array<MultiFab_*,_3> *pAVar3;
  EBFArrayBoxFactory *this;
  int *piVar4;
  int j;
  long lVar5;
  Real *pRVar6;
  long lVar7;
  int k;
  long lVar8;
  ulong uVar9;
  long lVar10;
  int j_1;
  ulong uVar11;
  long lVar12;
  Box local_294;
  Box local_278;
  Box local_25c;
  Real local_240;
  Array4<double> local_238;
  FabArray<amrex::EBCellFlagFab> *local_1f8;
  Array<MultiFab_*,_3> *local_1f0;
  Array4<double> local_1e8;
  Array4<double> local_1a8;
  Array<const_MultiCutFab_*,_3> local_168;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter mfi;
  
  local_240 = val;
  this = (EBFArrayBoxFactory *)
         __dynamic_cast((umac->_M_elems[0]->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                        super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                        _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                        &EBFArrayBoxFactory::typeinfo,0);
  if (this != (EBFArrayBoxFactory *)0x0) {
    EBFArrayBoxFactory::getAreaFrac(&local_168,this);
    local_1f8 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this);
    uVar1 = ((FabArrayBase *)umac->_M_elems[0])->n_comp;
    MFIter::MFIter(&mfi,(FabArrayBase *)umac->_M_elems[0],true);
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    uVar11 = (ulong)uVar1;
    local_1f0 = umac;
    while (pAVar3 = local_1f0, mfi.currentIndex < mfi.endIndex) {
      local_238.p = (double *)0x1;
      local_238.jstride._0_4_ = 0;
      MFIter::tilebox(&local_25c,&mfi,(IntVect *)&local_238);
      local_238.p = (double *)0x100000000;
      local_238.jstride._0_4_ = 0;
      MFIter::tilebox(&local_278,&mfi,(IntVect *)&local_238);
      local_238.p = (double *)0x0;
      local_238.jstride._0_4_ = 1;
      MFIter::tilebox(&local_294,&mfi,(IntVect *)&local_238);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_238,&pAVar3->_M_elems[0]->super_FabArray<amrex::FArrayBox>,&mfi);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_1a8,&pAVar3->_M_elems[1]->super_FabArray<amrex::FArrayBox>,&mfi);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_1e8,&pAVar3->_M_elems[2]->super_FabArray<amrex::FArrayBox>,&mfi);
      piVar4 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar4 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + mfi.currentIndex;
      }
      iVar2 = *(int *)&((local_1f8->m_fabs_v).
                        super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[*piVar4]->
                       super_BaseFab<amrex::EBCellFlag>).field_0x44;
      if (iVar2 == 1) {
        MultiCutFab::const_array(&local_d0,local_168._M_elems[0],&mfi);
        MultiCutFab::const_array(&local_110,local_168._M_elems[1],&mfi);
        MultiCutFab::const_array(&local_150,local_168._M_elems[2],&mfi);
        lVar8 = (long)local_25c.smallend.vect[0];
        lVar5 = 0;
        for (uVar9 = 0; lVar10 = (long)local_25c.smallend.vect[2], uVar9 != uVar11;
            uVar9 = uVar9 + 1) {
          for (; lVar12 = (long)local_25c.smallend.vect[1], (int)lVar10 <= local_25c.bigend.vect[2];
              lVar10 = lVar10 + 1) {
            for (; (int)lVar12 <= local_25c.bigend.vect[1]; lVar12 = lVar12 + 1) {
              for (lVar7 = 0; lVar8 + lVar7 <= (long)local_25c.bigend.vect[0]; lVar7 = lVar7 + 1) {
                if ((local_d0.p
                     [lVar8 + (((lVar12 - local_d0.begin.y) * local_d0.jstride +
                               (lVar10 - local_d0.begin.z) * local_d0.kstride + lVar7) -
                              (long)local_d0.begin.x)] == 0.0) &&
                   (!NAN(local_d0.p
                         [lVar8 + (((lVar12 - local_d0.begin.y) * local_d0.jstride +
                                   (lVar10 - local_d0.begin.z) * local_d0.kstride + lVar7) -
                                  (long)local_d0.begin.x)]))) {
                  *(Real *)((long)local_238.p +
                           lVar7 * 8 +
                           local_238.nstride * lVar5 +
                           (lVar12 - local_238.begin.y) *
                           CONCAT44(local_238.jstride._4_4_,(undefined4)local_238.jstride) * 8 +
                           (lVar10 - local_238.begin.z) * local_238.kstride * 8 +
                           (long)local_238.begin.x * -8 + lVar8 * 8) = local_240;
                }
              }
            }
          }
          lVar5 = lVar5 + 8;
        }
        lVar8 = (long)local_278.smallend.vect[0];
        lVar5 = 0;
        for (uVar9 = 0; lVar10 = (long)local_278.smallend.vect[2], uVar9 != uVar11;
            uVar9 = uVar9 + 1) {
          for (; lVar12 = (long)local_278.smallend.vect[1], (int)lVar10 <= local_278.bigend.vect[2];
              lVar10 = lVar10 + 1) {
            for (; (int)lVar12 <= local_278.bigend.vect[1]; lVar12 = lVar12 + 1) {
              for (lVar7 = 0; lVar8 + lVar7 <= (long)local_278.bigend.vect[0]; lVar7 = lVar7 + 1) {
                if ((local_110.p
                     [lVar8 + (((lVar12 - local_110.begin.y) * local_110.jstride +
                               (lVar10 - local_110.begin.z) * local_110.kstride + lVar7) -
                              (long)local_110.begin.x)] == 0.0) &&
                   (!NAN(local_110.p
                         [lVar8 + (((lVar12 - local_110.begin.y) * local_110.jstride +
                                   (lVar10 - local_110.begin.z) * local_110.kstride + lVar7) -
                                  (long)local_110.begin.x)]))) {
                  *(Real *)((long)local_1a8.p +
                           lVar7 * 8 +
                           local_1a8.nstride * lVar5 +
                           (lVar12 - local_1a8.begin.y) * local_1a8.jstride * 8 +
                           (lVar10 - local_1a8.begin.z) * local_1a8.kstride * 8 +
                           (long)local_1a8.begin.x * -8 + lVar8 * 8) = local_240;
                }
              }
            }
          }
          lVar5 = lVar5 + 8;
        }
        lVar8 = (long)local_294.smallend.vect[0];
        lVar5 = 0;
        for (uVar9 = 0; lVar10 = (long)local_294.smallend.vect[2], uVar9 != uVar11;
            uVar9 = uVar9 + 1) {
          for (; lVar12 = (long)local_294.smallend.vect[1], (int)lVar10 <= local_294.bigend.vect[2];
              lVar10 = lVar10 + 1) {
            for (; (int)lVar12 <= local_294.bigend.vect[1]; lVar12 = lVar12 + 1) {
              for (lVar7 = 0; lVar8 + lVar7 <= (long)local_294.bigend.vect[0]; lVar7 = lVar7 + 1) {
                if ((local_150.p
                     [lVar8 + (((lVar12 - local_150.begin.y) * local_150.jstride +
                               (lVar10 - local_150.begin.z) * local_150.kstride + lVar7) -
                              (long)local_150.begin.x)] == 0.0) &&
                   (!NAN(local_150.p
                         [lVar8 + (((lVar12 - local_150.begin.y) * local_150.jstride +
                                   (lVar10 - local_150.begin.z) * local_150.kstride + lVar7) -
                                  (long)local_150.begin.x)]))) {
                  *(Real *)((long)local_1e8.p +
                           lVar7 * 8 +
                           local_1e8.nstride * lVar5 +
                           (lVar12 - local_1e8.begin.y) * local_1e8.jstride * 8 +
                           (lVar10 - local_1e8.begin.z) * local_1e8.kstride * 8 +
                           (long)local_1e8.begin.x * -8 + lVar8 * 8) = local_240;
                }
              }
            }
          }
          lVar5 = lVar5 + 8;
        }
      }
      else if (iVar2 == -1) {
        lVar8 = 0;
        for (uVar9 = 0; lVar5 = (long)local_25c.smallend.vect[2], uVar9 != uVar11; uVar9 = uVar9 + 1
            ) {
          for (; lVar10 = (long)local_25c.smallend.vect[1], (int)lVar5 <= local_25c.bigend.vect[2];
              lVar5 = lVar5 + 1) {
            for (; (int)lVar10 <= local_25c.bigend.vect[1]; lVar10 = lVar10 + 1) {
              pRVar6 = (Real *)((long)local_238.p +
                               local_238.nstride * lVar8 +
                               (lVar5 - local_238.begin.z) * local_238.kstride * 8 +
                               (lVar10 - local_238.begin.y) *
                               CONCAT44(local_238.jstride._4_4_,(undefined4)local_238.jstride) * 8 +
                               (long)local_238.begin.x * -8 + (long)local_25c.smallend.vect[0] * 8);
              for (lVar12 = (long)local_25c.smallend.vect[0]; lVar12 <= local_25c.bigend.vect[0];
                  lVar12 = lVar12 + 1) {
                *pRVar6 = local_240;
                pRVar6 = pRVar6 + 1;
              }
            }
          }
          lVar8 = lVar8 + 8;
        }
        lVar8 = 0;
        for (uVar9 = 0; lVar5 = (long)local_278.smallend.vect[2], uVar9 != uVar11; uVar9 = uVar9 + 1
            ) {
          for (; lVar10 = (long)local_278.smallend.vect[1], (int)lVar5 <= local_278.bigend.vect[2];
              lVar5 = lVar5 + 1) {
            for (; (int)lVar10 <= local_278.bigend.vect[1]; lVar10 = lVar10 + 1) {
              pRVar6 = (Real *)((long)local_1a8.p +
                               local_1a8.nstride * lVar8 +
                               (lVar5 - local_1a8.begin.z) * local_1a8.kstride * 8 +
                               (lVar10 - local_1a8.begin.y) * local_1a8.jstride * 8 +
                               (long)local_1a8.begin.x * -8 + (long)local_278.smallend.vect[0] * 8);
              for (lVar12 = (long)local_278.smallend.vect[0]; lVar12 <= local_278.bigend.vect[0];
                  lVar12 = lVar12 + 1) {
                *pRVar6 = local_240;
                pRVar6 = pRVar6 + 1;
              }
            }
          }
          lVar8 = lVar8 + 8;
        }
        lVar8 = 0;
        for (uVar9 = 0; lVar5 = (long)local_294.smallend.vect[2], uVar9 != uVar11; uVar9 = uVar9 + 1
            ) {
          for (; lVar10 = (long)local_294.smallend.vect[1], (int)lVar5 <= local_294.bigend.vect[2];
              lVar5 = lVar5 + 1) {
            for (; (int)lVar10 <= local_294.bigend.vect[1]; lVar10 = lVar10 + 1) {
              pRVar6 = (Real *)((long)local_1e8.p +
                               local_1e8.nstride * lVar8 +
                               (lVar5 - local_1e8.begin.z) * local_1e8.kstride * 8 +
                               (lVar10 - local_1e8.begin.y) * local_1e8.jstride * 8 +
                               (long)local_1e8.begin.x * -8 + (long)local_294.smallend.vect[0] * 8);
              for (lVar12 = (long)local_294.smallend.vect[0]; lVar12 <= local_294.bigend.vect[0];
                  lVar12 = lVar12 + 1) {
                *pRVar6 = local_240;
                pRVar6 = pRVar6 + 1;
              }
            }
          }
          lVar8 = lVar8 + 8;
        }
      }
      MFIter::operator++(&mfi);
    }
    MFIter::~MFIter(&mfi);
  }
  return;
}

Assistant:

void
EB_set_covered_faces (const Array<MultiFab*,AMREX_SPACEDIM>& umac, Real val)
{
    const auto factory = dynamic_cast<EBFArrayBoxFactory const*>(&(umac[0]->Factory()));
    if (factory == nullptr) return;

    const auto& area = factory->getAreaFrac();
    const auto& flags = factory->getMultiEBCellFlagFab();
    const int ncomp = umac[0]->nComp();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(*umac[0],TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        AMREX_D_TERM(const Box& xbx = mfi.tilebox(IntVect::TheDimensionVector(0));,
                     const Box& ybx = mfi.tilebox(IntVect::TheDimensionVector(1));,
                     const Box& zbx = mfi.tilebox(IntVect::TheDimensionVector(2)));
        AMREX_D_TERM(Array4<Real> const& u = umac[0]->array(mfi);,
                     Array4<Real> const& v = umac[1]->array(mfi);,
                     Array4<Real> const& w = umac[2]->array(mfi));

        auto fabtyp = flags[mfi].getType();
        if (fabtyp == FabType::covered)
        {
            AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM (
                xbx, txbx,
                {
                    const auto lo = amrex::lbound(txbx);
                    const auto hi = amrex::ubound(txbx);
                    for (int n = 0; n < ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            u(i,j,k,n) = val;
                        }}}
                    }
                }
                ,ybx, tybx,
                {
                    const auto lo = amrex::lbound(tybx);
                    const auto hi = amrex::ubound(tybx);
                    for (int n = 0; n < ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            v(i,j,k,n) = val;
                        }}}
                    }
                }
                ,zbx, tzbx,
                {
                    const auto lo = amrex::lbound(tzbx);
                    const auto hi = amrex::ubound(tzbx);
                    for (int n = 0; n < ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            w(i,j,k,n) = val;
                        }}}
                    }
                }
            );
        }
        else if (fabtyp == FabType::singlevalued)
        {
            AMREX_D_TERM(Array4<Real const> const& ax = area[0]->const_array(mfi);,
                         Array4<Real const> const& ay = area[1]->const_array(mfi);,
                         Array4<Real const> const& az = area[2]->const_array(mfi));
            AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM (
                xbx, txbx,
                {
                    const auto lo = amrex::lbound(txbx);
                    const auto hi = amrex::ubound(txbx);
                    for (int n = 0; n < ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            if (ax(i,j,k) == 0.0) u(i,j,k,n) = val;
                        }}}
                    }
                }
                ,ybx, tybx,
                {
                    const auto lo = amrex::lbound(tybx);
                    const auto hi = amrex::ubound(tybx);
                    for (int n = 0; n < ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            if (ay(i,j,k) == 0.0) v(i,j,k,n) = val;
                        }}}
                    }
                }
                ,zbx, tzbx,
                {
                    const auto lo = amrex::lbound(tzbx);
                    const auto hi = amrex::ubound(tzbx);
                    for (int n = 0; n < ncomp; ++n) {
                        for (int k = lo.z; k <= hi.z; ++k) {
                        for (int j = lo.y; j <= hi.y; ++j) {
                        for (int i = lo.x; i <= hi.x; ++i) {
                            if (az(i,j,k) == 0.0) w(i,j,k,n) = val;
                        }}}
                    }
                }
            );
        }
    }
}